

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall
CMeshClosestPointMapper::CMeshClosestPointMapper
          (CMeshClosestPointMapper *this,ON_Mesh *mesh,ON_2fPointArray *tc,
          ON_RenderMeshInfo *pRenderMeshInfo,ON_Xform *objectXform)

{
  ON_Mesh *this_00;
  int nFis_00;
  bool bVar1;
  int iVar2;
  ON_MappingMeshInfo *pOVar3;
  ON_RTree *this_01;
  int *pFis;
  CMeshClosestPointMapper *this_02;
  long lVar4;
  ON_Xform *pOVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  int nFis;
  
  bVar7 = 0;
  (this->super_IClosestPointMapper)._vptr_IClosestPointMapper =
       (_func_int **)&PTR__CMeshClosestPointMapper_008257c8;
  this->m_mesh = mesh;
  this->m_tc = tc;
  pOVar3 = ON_Mesh::GetMappingMeshInfo(mesh);
  this->m_pMappingMeshInfo = pOVar3;
  this->m_pRenderMeshInfo = pRenderMeshInfo;
  (this->m_resFis)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  (this->m_resFis).m_a = (int *)0x0;
  (this->m_resFis).m_count = 0;
  (this->m_resFis).m_capacity = 0;
  pOVar5 = objectXform;
  pOVar6 = &this->m_objectXform;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
    pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  this_00 = &this->m_sourceMesh;
  ON_Mesh::ON_Mesh(this_00);
  this->m_pSourceCPM = (CMeshClosestPointMapper *)0x0;
  SeamTool::SeamTool(&this->m_seamTool,mesh,tc);
  this->m_totalMappingTol = 0.0;
  this->m_failedFaceMatches = 0;
  this_01 = (ON_RTree *)operator_new(0x48);
  ON_RTree::ON_RTree(this_01,0);
  this->m_pMeshFaceTree = this_01;
  ON_RTree::CreateMeshFaceTree(this_01,mesh);
  this->m_bMeshInfosMatch = false;
  if ((this->m_pMappingMeshInfo != (ON_MappingMeshInfo *)0x0) &&
     (this->m_pRenderMeshInfo != (ON_RenderMeshInfo *)0x0)) {
    bVar1 = ON_GeometryFingerprint::Matches
                      (&this->m_pMappingMeshInfo->m_geometryFingerprint,
                       &this->m_pRenderMeshInfo->m_geometryFingerprint,&this->m_objectXform,0.001);
    if (bVar1) {
      this->m_bMeshInfosMatch = true;
      nFis = 0;
      pFis = ON_MappingMeshInfo::SourceIdFaces
                       (this->m_pMappingMeshInfo,this->m_pRenderMeshInfo->m_sourceFaceId,&nFis);
      nFis_00 = nFis;
      if (pFis != (int *)0x0 && 0 < nFis) {
        iVar2 = ON_Mesh::FaceCount(this->m_mesh);
        if (nFis_00 < iVar2) {
          bVar1 = CreateSubMesh(this->m_mesh,this->m_tc,nFis_00,pFis,this_00);
          if (bVar1) {
            this_02 = (CMeshClosestPointMapper *)operator_new(0x840);
            CMeshClosestPointMapper
                      (this_02,this_00,&(this->m_sourceMesh).m_T,(ON_RenderMeshInfo *)0x0,
                       objectXform);
            this->m_pSourceCPM = this_02;
          }
        }
      }
    }
  }
  return;
}

Assistant:

CMeshClosestPointMapper(const ON_Mesh& mesh, const ON_2fPointArray& tc, const ON_RenderMeshInfo* pRenderMeshInfo, const ON_Xform& objectXform)
	: m_mesh(mesh),
		m_tc(tc),
		m_pMappingMeshInfo(mesh.GetMappingMeshInfo()),
		m_pRenderMeshInfo(pRenderMeshInfo),
		m_objectXform(objectXform),
		m_pSourceCPM(nullptr),
		m_totalMappingTol(0.0),
		m_failedFaceMatches(0),
		m_seamTool(mesh, tc)
	{
    m_pMeshFaceTree = new ON_RTree();
    m_pMeshFaceTree->CreateMeshFaceTree(&mesh);
		m_bMeshInfosMatch = false;
		if (m_pMappingMeshInfo != nullptr && m_pRenderMeshInfo != nullptr)
		{
			if (m_pMappingMeshInfo->m_geometryFingerprint.Matches(m_pRenderMeshInfo->m_geometryFingerprint, m_objectXform, 0.001))
			{
				m_bMeshInfosMatch = true;
				int nFis = 0;
				const int* pFis = m_pMappingMeshInfo->SourceIdFaces(m_pRenderMeshInfo->m_sourceFaceId, nFis);
				if (nFis > 0 && pFis != nullptr && nFis < m_mesh.FaceCount())
				{
					if (CreateSubMesh(m_mesh, m_tc, nFis, pFis, m_sourceMesh))
					{
						m_pSourceCPM = new CMeshClosestPointMapper(m_sourceMesh, m_sourceMesh.m_T, nullptr, objectXform);
					}
				}
			}
		}
	}